

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void * parse_switch(Parser *parser)

{
  uint row;
  uint col;
  Token *name;
  char *file;
  List *cases;
  void *pvVar1;
  void *block_00;
  CaseStmt *data;
  List *pLVar2;
  BlockStmt *data_00;
  ConstantTerm *expr;
  SwitchStmt *pSVar3;
  bool bVar4;
  KindMeta KVar5;
  void *constant;
  BlockStmt *local_30;
  void *def_expr;
  List *block;
  List *case_stmt;
  Token *id;
  Parser *parser_local;
  
  expect(parser,SWITCH);
  name = parser->token;
  expect(parser,ID);
  expect(parser,OP_FL_BRA);
  cases = new_list();
  local_30 = (BlockStmt *)0x0;
  while (parser->token->kind != CL_FL_BRA) {
    if (parser->token->kind == END) {
      expect(parser,CL_FL_BRA);
    }
    if (local_30 != (BlockStmt *)0x0) {
      log_debug(
               "/workspace/llm4binary/github/license_all_cmakelists_25/editso[P]timely-lang/parser.c:407"
               );
      file = parser->lexer->source;
      row = parser->token->row_pos;
      col = parser->token->col_pos;
      KVar5 = get_kind_meta(parser->token->kind);
      log_code(file,row,col,"Invalid statement: %s",KVar5.name);
    }
    move(parser);
    if (parser->token->kind == CASE) {
      expect(parser,CASE);
      pvVar1 = parse_constant(parser);
      expect(parser,COLON);
      if (parser->token->kind == OP_FL_BRA) {
        block_00 = parse_block(parser);
        data = new_case_stmt(pvVar1,block_00);
        list_add(cases,data);
      }
      else {
        pLVar2 = new_list();
        while (((parser->token->kind != CASE && (parser->token->kind != DEFAULT)) &&
               (parser->token->kind != CL_FL_BRA))) {
          pvVar1 = parse_stmt(parser);
          list_add(pLVar2,pvVar1);
          move(parser);
        }
        data_00 = new_block_stmt(pLVar2);
        list_add(cases,data_00);
        stack_push(parser->stack,parser->token);
      }
    }
    else if (parser->token->kind == DEFAULT) {
      move(parser);
      expect(parser,COLON);
      if (parser->token->kind == OP_FL_BRA) {
        local_30 = (BlockStmt *)parse_block(parser);
      }
      else {
        pLVar2 = new_list();
        while( true ) {
          bVar4 = false;
          if ((parser->token->kind != END) && (bVar4 = false, parser->token->kind != CL_FL_BRA)) {
            bVar4 = parser->token->kind != CASE;
          }
          if (!bVar4) break;
          pvVar1 = parse_stmt(parser);
          list_add(pLVar2,pvVar1);
          move(parser);
        }
        local_30 = new_block_stmt(pLVar2);
      }
    }
  }
  expect(parser,CL_FL_BRA);
  expr = new_constant_term(name);
  pSVar3 = new_switch_stmt(expr,cases,local_30);
  return pSVar3;
}

Assistant:

void *parse_switch(Parser *parser) {
    expect(parser, SWITCH);
    Token *id = token(parser);
//    out_token(token(parser));
    expect(parser, ID);
    expect(parser, OP_FL_BRA);
    List *case_stmt = new_list();
    List *block;
    void *def_expr = NULL;
    while (token(parser)->kind != CL_FL_BRA) {
        if (token(parser)->kind == END) {
            expect(parser, CL_FL_BRA);
        }
        if (def_expr != NULL) {
            parse_error(parser, "Invalid statement: %s", get_kind_meta(token(parser)->kind).name);
        }
        move(parser);
        if (token(parser)->kind == CASE) {
            expect(parser, CASE);
            void *constant = parse_constant(parser);
            expect(parser, COLON);
            if (token(parser)->kind == OP_FL_BRA) {
                list_add(case_stmt, new_case_stmt(constant, parse_block(parser)));
            } else {
                block = new_list();
                while (true) {
                    if (token(parser)->kind == CASE ||
                        token(parser)->kind == DEFAULT ||
                        token(parser)->kind == CL_FL_BRA)
                        break;
                    list_add(block, parse_stmt(parser));
                    move(parser);
                }
                list_add(case_stmt, new_block_stmt(block));
                push(parser, token(parser));
            }
        } else if (token(parser)->kind == DEFAULT) {
            move(parser);
            expect(parser, COLON);
            if (token(parser)->kind == OP_FL_BRA) {
                def_expr = parse_block(parser);
            } else {
                block = new_list();
                while (token(parser)->kind != END &&
                       token(parser)->kind != CL_FL_BRA &&
                       token(parser)->kind != CASE) {
                    list_add(block, parse_stmt(parser));
                    move(parser);
                }
                def_expr = new_block_stmt(block);
            }
        }
    }
    expect(parser, CL_FL_BRA);
    return new_switch_stmt(new_constant_term(id), case_stmt, def_expr);
}